

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O3

cf_errno_t cf_file_copy(cf_char_t *src,cf_char_t *dst)

{
  int __fd;
  int __fd_00;
  int iVar1;
  ssize_t sVar2;
  cf_errno_t cVar3;
  cf_char_t buff [1024];
  undefined1 auStack_428 [1032];
  
  cVar3 = 2;
  if (dst != (cf_char_t *)0x0 && src != (cf_char_t *)0x0) {
    __fd = open(src,0x42);
    if (__fd == 0) {
      cVar3 = 1;
    }
    else {
      __fd_00 = open(dst,0x42);
      if (__fd_00 == 0) {
        cVar3 = 1;
      }
      else {
        sVar2 = read(__fd,auStack_428,0x400);
        iVar1 = (int)sVar2;
        while (iVar1 != 0) {
          write(__fd_00,auStack_428,(long)(int)sVar2);
          sVar2 = read(__fd,auStack_428,0x400);
          iVar1 = (int)sVar2;
        }
        close(__fd);
        cVar3 = 0;
        __fd = __fd_00;
      }
      close(__fd);
    }
  }
  return cVar3;
}

Assistant:

cf_errno_t  cf_file_copy(const cf_char_t* src, const cf_char_t* dst) {
#ifndef CF_OS_WIN
    cf_int_t fd1 = 0;
    cf_int_t fd2 = 0;
    cf_int_t len;
    cf_char_t buff[1024]; 
#endif
    if(!src || !dst) return CF_EPARAM;
    
#ifdef CF_OS_WIN
    return CopyFileA(src, dst, 0) ? CF_OK : CF_NOK; /* copy force */
#else
    fd1 = open(src,O_RDWR|O_CREAT);
    if(!fd1) return CF_NOK;

    fd2 = open(dst,O_RDWR|O_CREAT);
    if(!fd2) {
        close(fd1);
        return CF_NOK;
    }
    while((len = read(fd1, buff, sizeof(buff)))) {  
        write(fd2, buff, len);
    }
    close(fd1);
    close(fd2);
    return CF_OK;
#endif
}